

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::toString(longdouble in)

{
  String *in_RDI;
  int in_stack_000001dc;
  longdouble in_stack_000001e0;
  
  anon_unknown_14::fpToString<long_double>(in_stack_000001e0,in_stack_000001dc);
  return in_RDI;
}

Assistant:

String toString(double long in) { return fpToString(in, 15); }